

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O0

Matrix4f * __thiscall
eos::fitting::RenderingParameters::get_projection
          (Matrix4f *__return_storage_ptr__,RenderingParameters *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  float *pfVar4;
  float aspect_ratio;
  RenderingParameters *this_local;
  Matrix4<float> *ortho;
  
  if (this->camera_type == Orthographic) {
    render::ortho<float>
              (__return_storage_ptr__,(this->frustum).l,(this->frustum).r,(this->frustum).b,
               (this->frustum).t);
  }
  else {
    bVar3 = std::optional<float>::has_value(&this->fov_y);
    if (!bVar3) {
      __assert_fail("fov_y.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/RenderingParameters.hpp"
                    ,0xfd,
                    "Eigen::Matrix4f eos::fitting::RenderingParameters::get_projection() const");
    }
    iVar1 = this->screen_width;
    iVar2 = this->screen_height;
    pfVar4 = std::optional<float>::value(&this->fov_y);
    render::perspective<float>
              (__return_storage_ptr__,*pfVar4,(float)iVar1 / (float)iVar2,0.1,1000.0);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4f get_projection() const
    {
        if (camera_type == CameraType::Orthographic)
        {
            const auto ortho = render::ortho(frustum.l, frustum.r, frustum.b, frustum.t);
            return ortho;
        } else
        {
            assert(fov_y.has_value()); // Might be worth throwing an exception instead.
            const float aspect_ratio = static_cast<double>(screen_width) / screen_height;
            const auto persp_mtx = render::perspective(fov_y.value(), aspect_ratio, 0.1f, 1000.0f);
            return persp_mtx;
        }
    }